

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_warp_horizontal_filter_avx2
               (uint8_t *ref,__m256i *horz_out,int stride,int32_t ix4,int32_t iy4,int32_t sx4,
               int alpha,int beta,int p_height,int height,int i,__m256i *round_const,__m128i *shift,
               __m256i *shuffle_src)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  __m256i *in_stack_00000038;
  int32_t in_stack_00000088;
  int32_t in_stack_0000008c;
  int in_stack_00000094;
  undefined4 in_stack_0000009c;
  undefined4 in_stack_000000a4;
  
  if ((in_stack_00000008 == 0) && (in_stack_00000010 == 0)) {
    warp_horizontal_filter_alpha0_beta0_avx2
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_height),
               (__m256i *)CONCAT44(in_stack_0000009c,beta),in_stack_00000094,alpha,in_stack_0000008c
               ,in_stack_00000088,0,in_stack_00000018,in_stack_00000020,in_stack_00000028,
               in_stack_00000030,in_stack_00000038,(__m128i *)CONCAT44(iy4,sx4),
               (__m256i *)CONCAT44(in_R8D,in_R9D));
  }
  else if ((in_stack_00000008 == 0) && (in_stack_00000010 != 0)) {
    warp_horizontal_filter_alpha0_avx2
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_height),
               (__m256i *)CONCAT44(in_stack_0000009c,beta),in_stack_00000094,alpha,in_stack_0000008c
               ,in_stack_00000088,in_stack_00000010,in_stack_00000018,in_stack_00000020,
               in_stack_00000028,in_stack_00000030,in_stack_00000038,(__m128i *)CONCAT44(iy4,sx4),
               (__m256i *)CONCAT44(in_R8D,in_R9D));
  }
  else if ((in_stack_00000008 == 0) || (in_stack_00000010 != 0)) {
    warp_horizontal_filter_avx2
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_height),
               (__m256i *)CONCAT44(in_stack_0000009c,beta),in_stack_00000094,alpha,in_stack_0000008c
               ,in_stack_00000088,in_stack_00000010,in_stack_00000018,in_stack_00000020,
               in_stack_00000028,in_stack_00000030,in_stack_00000038,(__m128i *)CONCAT44(iy4,sx4),
               (__m256i *)CONCAT44(in_R8D,in_R9D));
  }
  else {
    warp_horizontal_filter_beta0_avx2
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_height),
               (__m256i *)CONCAT44(in_stack_0000009c,beta),in_stack_00000094,alpha,in_stack_0000008c
               ,in_stack_00000088,0,in_stack_00000018,in_stack_00000020,in_stack_00000028,
               in_stack_00000030,in_stack_00000038,(__m128i *)CONCAT44(iy4,sx4),
               (__m256i *)CONCAT44(in_R8D,in_R9D));
  }
  return;
}

Assistant:

static inline void prepare_warp_horizontal_filter_avx2(
    const uint8_t *ref, __m256i *horz_out, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const __m256i *round_const, const __m128i *shift,
    const __m256i *shuffle_src) {
  if (alpha == 0 && beta == 0)
    warp_horizontal_filter_alpha0_beta0_avx2(
        ref, horz_out, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
        round_const, shift, shuffle_src);
  else if (alpha == 0 && beta != 0)
    warp_horizontal_filter_alpha0_avx2(ref, horz_out, stride, ix4, iy4, sx4,
                                       alpha, beta, p_height, height, i,
                                       round_const, shift, shuffle_src);
  else if (alpha != 0 && beta == 0)
    warp_horizontal_filter_beta0_avx2(ref, horz_out, stride, ix4, iy4, sx4,
                                      alpha, beta, p_height, height, i,
                                      round_const, shift, shuffle_src);
  else
    warp_horizontal_filter_avx2(ref, horz_out, stride, ix4, iy4, sx4, alpha,
                                beta, p_height, height, i, round_const, shift,
                                shuffle_src);
}